

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tempseat.c
# Opt level: O0

void tempseat_flush(Seat *seat)

{
  SeatVtable *ptr;
  Seat *pSVar1;
  size_t sVar2;
  output_chunk *chunk;
  ptrlen pl;
  TempSeat *ts;
  Seat *seat_local;
  
  if (seat->vt != &tempseat_vt) {
    __assert_fail("seat->vt == &tempseat_vt",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/tempseat.c"
                  ,0x187,"void tempseat_flush(Seat *)");
  }
  pSVar1 = seat + -10;
  while( true ) {
    sVar2 = bufchain_size((bufchain *)(seat + -9));
    if (sVar2 == 0) {
      if (seat[-4].vt != (SeatVtable *)0x0) {
        __assert_fail("!ts->outchunk_head",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/tempseat.c"
                      ,0x19f,"void tempseat_flush(Seat *)");
      }
      if (((ulong)seat[-2].vt & 1) != 0) {
        seat_notify_session_started((Seat *)pSVar1->vt);
      }
      if (((ulong)seat[-2].vt & 0x100) != 0) {
        seat_notify_remote_exit((Seat *)pSVar1->vt);
      }
      if (((ulong)seat[-2].vt & 0x10000) != 0) {
        seat_notify_remote_disconnect((Seat *)pSVar1->vt);
      }
      if (((ulong)seat[-2].vt & 0x1000000) != 0) {
        seat_update_specials_menu((Seat *)pSVar1->vt);
      }
      if (((ulong)seat[-2].vt & 0x100000000) != 0) {
        seat_echoedit_update
                  ((Seat *)pSVar1->vt,(_Bool)(*(byte *)((long)&seat[-2].vt + 5) & 1),
                   (_Bool)(*(byte *)((long)&seat[-2].vt + 6) & 1));
      }
      if (((ulong)seat[-2].vt & 0x100000000000000) != 0) {
        seat_set_trust_status((Seat *)pSVar1->vt,(_Bool)(*(byte *)&seat[-1].vt & 1));
      }
      return;
    }
    _chunk = bufchain_prefix((bufchain *)(seat + -9));
    if (seat[-4].vt == (SeatVtable *)0x0) break;
    ptr = seat[-4].vt;
    if (ptr->sent < pl.ptr) {
      pl.ptr = ptr->sent;
    }
    seat_output((Seat *)pSVar1->vt,*(SeatOutputType *)&ptr->eof,chunk,(size_t)pl.ptr);
    bufchain_consume((bufchain *)(seat + -9),(size_t)pl.ptr);
    ptr->sent = ptr->sent + -(long)pl.ptr;
    if (ptr->sent == (_func_void_Seat_ptr_size_t *)0x0) {
      seat[-4].vt = (SeatVtable *)ptr->output;
      safefree(ptr);
    }
  }
  __assert_fail("ts->outchunk_head",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/tempseat.c"
                ,399,"void tempseat_flush(Seat *)");
}

Assistant:

void tempseat_flush(Seat *seat)
{
    assert(seat->vt == &tempseat_vt);
    TempSeat *ts = container_of(seat, TempSeat, seat);

    /* Empty the output bufchains into the real seat, taking care to
     * preserve both separation and interleaving */
    while (bufchain_size(&ts->output)) {
        ptrlen pl = bufchain_prefix(&ts->output);

        assert(ts->outchunk_head);
        struct output_chunk *chunk = ts->outchunk_head;

        if (pl.len > chunk->size)
            pl.len = chunk->size;

        seat_output(ts->realseat, chunk->type, pl.ptr, pl.len);
        bufchain_consume(&ts->output, pl.len);
        chunk->size -= pl.len;
        if (chunk->size == 0) {
            ts->outchunk_head = chunk->next;
            sfree(chunk);
        }
    }

    /* That should have exactly emptied the output chunk list too */
    assert(!ts->outchunk_head);

    /* Pass on any other kinds of event we've buffered */
    if (ts->seen_session_started)
        seat_notify_session_started(ts->realseat);
    if (ts->seen_remote_exit)
        seat_notify_remote_exit(ts->realseat);
    if (ts->seen_remote_disconnect)
        seat_notify_remote_disconnect(ts->realseat);
    if (ts->seen_update_specials_menu)
        seat_update_specials_menu(ts->realseat);
    if (ts->seen_echoedit_update)
        seat_echoedit_update(ts->realseat, ts->echoing, ts->editing);
    if (ts->seen_trust_status)
        seat_set_trust_status(ts->realseat, ts->trusted);
}